

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  long lVar1;
  RtreeNode *pNode_00;
  int iCell_00;
  int iVar2;
  RtreeNode *pParent;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  int iCell;
  RtreeCell cell;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 100;
  do {
    pNode_00 = pNode->pParent;
    if (pNode_00 == (RtreeNode *)0x0) {
      iVar3 = 0;
LAB_001dd21d:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return iVar3;
    }
    cell.iRowid = (i64)&DAT_aaaaaaaaaaaaaaaa;
    cell.aCoord[8] = (RtreeCoord)0xffffffff;
    cell.aCoord[9] = (RtreeCoord)0xffffffff;
    cell.aCoord[4].i = -1;
    cell.aCoord[5].i = -1;
    cell.aCoord[6].i = -1;
    cell.aCoord[7].i = -1;
    cell.aCoord[0].i = -1;
    cell.aCoord[1].i = -1;
    cell.aCoord[2].i = -1;
    cell.aCoord[3].i = -1;
    iCell = -0x55555556;
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if ((bVar4) || (iVar2 = nodeParentIndex(pRtree,pNode,&iCell), iCell_00 = iCell, iVar2 != 0)) {
      iVar3 = 0x10b;
      goto LAB_001dd21d;
    }
    nodeGetCell(pRtree,pNode_00,iCell,&cell);
    iVar2 = cellContains(pRtree,&cell,pCell);
    pNode = pNode_00;
    if (iVar2 == 0) {
      cellUnion(pRtree,&cell,pCell);
      nodeOverwriteCell(pRtree,pNode_00,&cell,iCell_00);
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  int cnt = 0;
  int rc;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    cnt++;
    if( NEVER(cnt>100) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    rc = nodeParentIndex(pRtree, p, &iCell);
    if( NEVER(rc!=SQLITE_OK) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }

    p = pParent;
  }
  return SQLITE_OK;
}